

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.h
# Opt level: O0

void __thiscall apollonia::Arbiter::AddContact(Arbiter *this,Contact *contact)

{
  size_type sVar1;
  Contact *contact_local;
  Arbiter *this_local;
  
  std::vector<apollonia::Contact,_std::allocator<apollonia::Contact>_>::push_back
            (&this->contacts_,contact);
  sVar1 = std::vector<apollonia::Contact,_std::allocator<apollonia::Contact>_>::size
                    (&this->contacts_);
  if (sVar1 < 3) {
    return;
  }
  __assert_fail("contacts_.size() <= kMaxContacts",
                "/workspace/llm4binary/github/license_c_cmakelists/wgtdkp[P]apollonia/src/collision.h"
                ,0x35,"void apollonia::Arbiter::AddContact(const Contact &)");
}

Assistant:

void AddContact(const Contact& contact) {
    contacts_.push_back(contact);
    assert(contacts_.size() <= kMaxContacts);
  }